

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Frame::Frame(Frame *this,FrameKind *kind,LocationRange *location)

{
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RSI;
  LocationRange *in_RDI;
  LocationRange *in_stack_ffffffffffffffd8;
  
  *(undefined4 *)&in_RDI->file = *(undefined4 *)&(in_RSI->_M_dataplus)._M_p;
  (in_RDI->file)._M_string_length = 0;
  LocationRange::LocationRange(in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[1].file.field_2._M_local_buf[0] = '\0';
  __gnu_cxx::
  __normal_iterator<const_jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  ::__normal_iterator((__normal_iterator<const_jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                       *)&in_RDI[1].end.column);
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
         *)0x23eb1f);
  *(undefined4 *)&in_RDI[2].end.line = 0;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         *)0x23eb3a);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            *)0x23eb4b);
  std::__cxx11::u32string::u32string(in_RSI);
  std::__cxx11::string::string((string *)&in_RDI[4].begin.column);
  in_RDI[5].file._M_string_length = 0;
  in_RDI[5].file.field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&in_RDI[5].file.field_2 + 8) = 0;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         *)0x23eb9e);
  *(undefined4 *)((long)&in_RDI[1].file.field_2 + 8) = 0;
  *(undefined4 *)&in_RDI[1].begin.column = 0;
  return;
}

Assistant:

Frame(const FrameKind &kind, const LocationRange &location)
        : kind(kind),
          ast(nullptr),
          location(location),
          tailCall(false),
          elementId(0),
          context(NULL),
          self(NULL),
          offset(0)
    {
        val.t = Value::NULL_TYPE;
        val2.t = Value::NULL_TYPE;
    }